

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relu.cpp
# Opt level: O1

int __thiscall ncnn::ReLU::forward_inplace_int8(ReLU *this,Mat *bottom_top_blob,Option *opt)

{
  uint uVar1;
  void *pvVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  
  uVar1 = bottom_top_blob->c;
  if (0 < (int)uVar1 && this->slope == 0.0) {
    uVar3 = bottom_top_blob->h * bottom_top_blob->w;
    uVar4 = 0;
    do {
      if (0 < (int)uVar3) {
        lVar5 = bottom_top_blob->elemsize * bottom_top_blob->cstep * uVar4;
        pvVar2 = bottom_top_blob->data;
        uVar6 = 0;
        do {
          if (*(char *)((long)pvVar2 + uVar6 + lVar5) < '\0') {
            *(undefined1 *)((long)pvVar2 + uVar6 + lVar5) = 0;
          }
          uVar6 = uVar6 + 1;
        } while (uVar3 != uVar6);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != uVar1);
  }
  return 0;
}

Assistant:

int ReLU::forward_inplace_int8(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    if (slope == 0.f)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            signed char* ptr = bottom_top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] = 0;
            }
        }
    }
    else
    {
        // TODO
        // #pragma omp parallel for num_threads(opt.num_threads)
        // for (int q=0; q<channels; q++)
        // {
        //     float* ptr = bottom_top_blob.channel(q);

        //     for (int i=0; i<size; i++)
        //     {
        //         if (ptr[i] < 0)
        //             ptr[i] *= slope;
        //     }
        // }
    }

    return 0;
}